

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CIBuildOnlyReporter.cpp
# Opt level: O1

bool ApprovalTests::CIBuildOnlyReporter::isRunningUnderCI(void)

{
  size_type sVar1;
  char *in_RDX;
  char *extraout_RDX;
  char *extraout_RDX_00;
  long lVar2;
  bool bVar3;
  string local_50;
  
  bVar3 = true;
  lVar2 = 0;
  while( true ) {
    SystemUtils::safeGetEnv_abi_cxx11_
              (&local_50,*(SystemUtils **)((long)&PTR_anon_var_dwarf_13b08b_001b4240 + lVar2),in_RDX
              );
    sVar1 = local_50._M_string_length;
    in_RDX = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
      in_RDX = extraout_RDX_00;
    }
    if (sVar1 != 0) break;
    lVar2 = lVar2 + 8;
    bVar3 = lVar2 != 0x38;
    if (!bVar3) {
      return bVar3;
    }
  }
  return bVar3;
}

Assistant:

bool CIBuildOnlyReporter::isRunningUnderCI()
    {
        /*
        auto AppVeyor = {"CI", "APPVEYOR"}; // https://www.appveyor.com/docs/environment-variables/
        auto AzurePipelines = {"TF_BUILD"}; // https://docs.microsoft.com/en-us/azure/devops/pipelines/build/variables?view=azure-devops&viewFallbackFrom=vsts&tabs=yaml
        auto GitHubActions = {"GITHUB_ACTIONS"}; // https://help.github.com/en/actions/configuring-and-managing-workflows/using-environment-variables
        auto GoCD = {"GO_SERVER_URL"}: // https://docs.gocd.org/current/faq/dev_use_current_revision_in_build.html
        auto Jenkins = {"JENKINS_URL"}: // https://wiki.jenkins.io/display/JENKINS/Building+a+software+project
        auto TeamCity = {"TEAMCITY_VERSION"}; // https://confluence.jetbrains.com/display/TCD18/Predefined+Build+Parameters
        auto Travis = {"CI", "TRAVIS", "CONTINUOUS_INTEGRATION"}; // https://docs.travis-ci.com/user/environment-variables/#default-environment-variables
        auto environmentVariablesForCI = combine({
            // begin-snippet: supported_ci_systems
            AppVeyor,
            AzurePipelines,
            GitHubActions,
            GoCD
            Jenkins,
            TeamCity,
            Travis,
            // end-snippet
        });
         */
        auto environmentVariablesForCI = {
            // begin-snippet: supported_ci_env_vars
            "CI",
            "CONTINUOUS_INTEGRATION",
            "GITHUB_ACTIONS",
            "GO_SERVER_URL",
            "JENKINS_URL",
            "TEAMCITY_VERSION",
            "TF_BUILD"
            // end-snippet
        };
        for (const auto& variable : environmentVariablesForCI)
        {
            if (!SystemUtils::safeGetEnv(variable).empty())
            {
                return true;
            }
        }
        return false;
    }